

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  char local_1c [4];
  
  pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar3) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  sVar1 = (grp->caption_)._M_string_length;
  pcVar4 = pcVar3;
  if (sVar1 != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(buffer,sVar1 + 4);
    local_1c[3] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 3);
    pcVar2 = (grp->caption_)._M_dataplus._M_p;
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)buffer,
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,pcVar2,pcVar2 + (grp->caption_)._M_string_length);
    local_1c[2] = 0x3a;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 2);
    local_1c[1] = 10;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c + 1);
    local_1c[0] = '\n';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,local_1c);
    pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return (long)pcVar3 - (long)pcVar4;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}